

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<short,(char)44>
               (char *string_ptr,idx_t string_size,short *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  short sVar1;
  bool bVar2;
  IntegerCastData<short> *pIVar3;
  uint uVar4;
  IntegerCastData<short> *pIVar5;
  IntegerCastData<short> *pIVar6;
  IntegerCastData<short> *pIVar7;
  IntegerCastData<short> *pIVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  byte bVar12;
  undefined7 uVar15;
  ulong uVar13;
  duckdb *pdVar14;
  uint uVar16;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  int params_2;
  byte bVar17;
  IntegerCastData<short> *pIVar18;
  uint params_1;
  uint uVar19;
  string error;
  DecimalCastData<short> local_dc;
  undefined4 local_d0;
  uint local_cc;
  short *local_c8;
  IntegerCastData<short> *local_c0;
  IntegerCastData<short> *local_b8;
  IntegerCastData<short> *local_b0;
  string local_a8;
  uint local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  CastParameters *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  params_2 = CONCAT31(in_register_00000089,scale);
  local_dc.result = 0;
  local_dc.excessive_decimals = '\0';
  local_dc.exponent_type = NONE;
  local_dc.digit_count = '\0';
  local_dc.decimal_count = '\0';
  local_dc.round_set = false;
  local_dc.should_round = false;
  local_dc.limit =
       *(StoreType *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000081,width) & 0xffffffff) * 8);
  uVar9 = (uint)width;
  params_1 = (uint)scale;
  uVar19 = (uint)string_size;
  local_dc.width = width;
  local_dc.scale = scale;
  local_78 = parameters;
  if (string_size != 0) {
    uVar10 = 0;
    do {
      bVar12 = string_ptr[uVar10];
      uVar16 = (uint)bVar12;
      if ((4 < uVar16 - 9) && (uVar16 != 0x20)) {
        if (uVar16 == 0x2d) {
          if (string_size - 1 != uVar10) {
            pIVar3 = (IntegerCastData<short> *)(string_size - uVar10);
            uVar16 = uVar9 - params_1;
            pIVar5 = (IntegerCastData<short> *)&DAT_00000001;
            local_dc.digit_count = 0;
            local_dc.result = 0;
            goto LAB_002abd9b;
          }
          DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>(&local_dc);
          break;
        }
        if (bVar12 == 0x30 && string_size - 1 != uVar10) {
          bVar17 = string_ptr[uVar10 + 1];
          if (bVar17 < 0x62) {
            if ((bVar17 != 0x42) && (bVar17 != 0x58)) goto LAB_002abe73;
          }
          else if ((bVar17 != 0x62) && (bVar17 != 0x78)) goto LAB_002abe73;
          if ((string_size - uVar10) - 3 < 0xfffffffffffffffe) break;
        }
        else {
LAB_002abe73:
          pIVar3 = (IntegerCastData<short> *)(string_size - uVar10);
          pIVar5 = (IntegerCastData<short> *)(ulong)(bVar12 == 0x2b);
          if (pIVar5 < pIVar3) {
            uVar16 = uVar9 - params_1;
            uVar13 = 0;
            local_dc.result = 0;
            pIVar6 = pIVar5;
            goto LAB_002abea3;
          }
        }
        DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_dc);
        break;
      }
      uVar10 = uVar10 + 1;
    } while (string_size != uVar10);
    goto LAB_002abf5e;
  }
  local_88 = 0;
  goto LAB_002abf96;
  while( true ) {
    if (string_ptr[(long)(uVar10 + 1 + (long)&pIVar5->result)] == '_') {
      if (((string_size - (long)pIVar5) - 2 == uVar10) ||
         (pIVar5 = pIVar5 + 1, 9 < (byte)((string_ptr + (long)pIVar5)[uVar10] - 0x30U)))
      goto LAB_002abf54;
    }
    else {
      pIVar5 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
    }
    pIVar7 = pIVar5;
    if (pIVar3 <= pIVar5) break;
LAB_002abd9b:
    bVar17 = string_ptr[(long)(uVar10 + (long)&pIVar5->result)];
    bVar12 = bVar17 - 0x30;
    if (9 < bVar12) {
      local_dc._5_3_ = 0;
      pIVar6 = pIVar5;
      if (bVar17 != 0x2c) goto LAB_002ac31a;
      pIVar18 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
      pIVar7 = pIVar18;
      if (pIVar3 <= pIVar18) goto LAB_002ac3ef;
      uVar13 = 0;
      local_b8 = (IntegerCastData<short> *)CONCAT44(local_b8._4_4_,(uint)local_dc.digit_count);
      local_d0 = 0;
      local_cc = 0;
      uVar16 = 0;
      pIVar6 = pIVar18;
      goto LAB_002ac0ba;
    }
    if (bVar12 == 0 && local_dc.result == 0) {
      local_dc.result = 0;
    }
    else {
      if ((uVar16 == local_dc.digit_count) ||
         (local_dc.digit_count = local_dc.digit_count + 1, local_dc.result < -0xccc))
      goto LAB_002abf54;
      local_dc.result = local_dc.result * 10 - (ushort)bVar12;
    }
    pIVar7 = pIVar3;
    if (~(ulong)pIVar5 + string_size == uVar10) break;
  }
  local_dc._5_3_ = 0;
LAB_002ac17f:
  local_c8 = result;
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>(&local_dc);
  if ((bVar2) && ((IntegerCastData<short> *)&DAT_00000001 < pIVar7)) goto LAB_002ac2d3;
  goto LAB_002abf5e;
LAB_002ac0ba:
  do {
    bVar17 = (string_ptr + (long)pIVar6)[uVar10];
    bVar12 = bVar17 - 0x30;
    local_dc.decimal_count = (uint8_t)uVar16;
    local_c0 = pIVar18;
    if (9 < bVar12) {
      local_dc.round_set = local_cc._0_1_;
      local_dc.should_round = (bool)(char)local_d0;
      local_c8 = result;
      if (pIVar18 < pIVar6 || (IntegerCastData<short> *)&DAT_00000001 < pIVar5) goto LAB_002ac31a;
      goto LAB_002abf5e;
    }
    if ((local_dc.decimal_count == scale) && (local_cc._0_1_ == false)) {
      uVar15 = (undefined7)(uVar13 >> 8);
      local_d0 = (undefined4)CONCAT71(uVar15,4 < bVar12);
      local_cc = (uint)CONCAT71(uVar15,1);
    }
    bVar2 = uVar16 + local_dc.digit_count < 4;
    sVar1 = local_dc.result * 10 - (ushort)bVar12;
    if (!bVar2) {
      sVar1 = local_dc.result;
    }
    local_dc.result = sVar1;
    local_dc.decimal_count = local_dc.decimal_count + bVar2;
    uVar16 = (uint)local_dc.decimal_count;
    uVar13 = ~(ulong)pIVar6 + string_size;
    local_dc.should_round = SUB41(local_d0,0);
    pIVar7 = pIVar3;
    if (uVar13 == uVar10) break;
    if ((string_ptr + (long)pIVar6)[uVar10 + 1] == '_') {
      if ((string_size - (long)pIVar6) - 2 != uVar10) {
        pIVar6 = pIVar6 + 1;
        bVar12 = (string_ptr + (long)pIVar6)[uVar10] - 0x30;
        uVar13 = CONCAT71((int7)((ulong)(string_ptr + (long)pIVar6) >> 8),bVar12);
        if (bVar12 < 10) goto LAB_002ac15c;
      }
      local_dc.round_set = SUB41(local_cc,0);
      goto LAB_002ac556;
    }
    pIVar6 = (IntegerCastData<short> *)((long)&pIVar6->result + 1);
LAB_002ac15c:
    pIVar7 = pIVar6;
  } while (pIVar6 < pIVar3);
  local_dc.round_set = SUB41(local_cc,0);
LAB_002ac3ef:
  if (((IntegerCastData<short> *)&DAT_00000001 < pIVar5) || (local_c8 = result, pIVar18 < pIVar7))
  goto LAB_002ac17f;
  goto LAB_002abf5e;
LAB_002ac31a:
  uVar4 = (uint)bVar17;
  if (bVar17 < 0x20) {
    local_c8 = result;
    if (uVar4 - 9 < 5) {
LAB_002ac32f:
      pIVar5 = (IntegerCastData<short> *)((long)&pIVar6->result + 1);
      pIVar7 = pIVar5;
      if (pIVar5 < pIVar3) {
        do {
          if ((4 < (byte)(string_ptr + (long)pIVar5)[uVar10] - 9) &&
             (local_c8 = result, (string_ptr + (long)pIVar5)[uVar10] != 0x20)) goto LAB_002abf5e;
          pIVar5 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
          pIVar7 = pIVar3;
        } while (pIVar3 != pIVar5);
      }
      goto LAB_002ac17f;
    }
  }
  else if ((bVar17 == 0x65) || (uVar4 == 0x45)) {
    local_c8 = result;
    if ((pIVar6 != (IntegerCastData<short> *)&DAT_00000001) &&
       (pIVar5 = (IntegerCastData<short> *)((long)&pIVar6->result + 1), pIVar5 < pIVar3)) {
      local_a8._M_dataplus._M_p._0_2_ = 0;
      pdVar14 = (duckdb *)(string_ptr + (long)pIVar6 + uVar10 + 1);
      pcVar11 = (char *)(~uVar10 + (string_size - (long)pIVar6));
      if (*pdVar14 == (duckdb)0x2d) {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar14,pcVar11,(idx_t)&local_a8,pIVar5,SUB41(uVar16,0));
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar14,pcVar11,(idx_t)&local_a8,pIVar5,SUB41(uVar16,0));
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,true>
                          (&local_dc,(int)(short)local_a8._M_dataplus._M_p);
        goto LAB_002ac5a8;
      }
    }
  }
  else {
    local_c8 = result;
    if (uVar4 == 0x20) goto LAB_002ac32f;
  }
  goto LAB_002abf5e;
  while( true ) {
    if (string_ptr[uVar10 + 1 + (long)&pIVar6->result] == '_') {
      if (((string_size - (long)pIVar6) - 2 == uVar10) ||
         (pIVar6 = pIVar6 + 1, 9 < (byte)((string_ptr + (long)pIVar6)[uVar10] - 0x30U)))
      goto LAB_002abf54;
    }
    else {
      pIVar6 = (IntegerCastData<short> *)((long)&pIVar6->result + 1);
    }
    pIVar8 = pIVar6;
    if (pIVar3 <= pIVar6) break;
LAB_002abea3:
    local_dc.digit_count = (uint8_t)uVar13;
    bVar17 = string_ptr[uVar10 + (long)&pIVar6->result];
    bVar12 = bVar17 - 0x30;
    uVar4 = (uint)uVar13;
    local_b8 = pIVar5;
    if (9 < bVar12) {
      local_dc._5_3_ = 0;
      pIVar18 = pIVar6;
      if (bVar17 != 0x2c) goto LAB_002ac456;
      pIVar7 = (IntegerCastData<short> *)((long)&pIVar6->result + 1);
      pIVar8 = pIVar7;
      if (pIVar3 <= pIVar7) goto LAB_002ac52c;
      local_c0 = (IntegerCastData<short> *)((ulong)local_c0 & 0xffffffff00000000);
      local_d0 = 0;
      uVar16 = 0;
      pIVar18 = pIVar7;
      goto LAB_002ac1ef;
    }
    if (bVar12 == 0 && local_dc.result == 0) {
      local_dc.result = 0;
    }
    else {
      if (uVar16 == uVar4) goto LAB_002abf54;
      local_dc.digit_count = local_dc.digit_count + 1;
      uVar13 = (ulong)local_dc.digit_count;
      if (0xccc < local_dc.result) goto LAB_002abf54;
      local_dc.result = (ushort)bVar12 + local_dc.result * 10;
    }
    local_dc.digit_count = (uint8_t)uVar13;
    pIVar8 = pIVar3;
    if (~(ulong)pIVar6 + string_size == uVar10) break;
  }
  local_dc._5_3_ = 0;
LAB_002ac2b6:
  local_c8 = result;
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_dc);
  if ((bVar2) && (local_b8 < pIVar8)) {
LAB_002ac2d3:
    *result = local_dc.result;
    return true;
  }
  goto LAB_002abf5e;
LAB_002ac456:
  uVar4 = (uint)bVar17;
  if (bVar17 < 0x20) {
    local_c8 = result;
    if (uVar4 - 9 < 5) {
LAB_002ac46b:
      pIVar5 = (IntegerCastData<short> *)((long)&pIVar18->result + 1);
      pIVar8 = pIVar5;
      if (pIVar5 < pIVar3) {
        do {
          if ((4 < (byte)(string_ptr + (long)pIVar5)[uVar10] - 9) &&
             (local_c8 = result, (string_ptr + (long)pIVar5)[uVar10] != 0x20)) goto LAB_002abf5e;
          pIVar5 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
          pIVar8 = pIVar3;
        } while (pIVar3 != pIVar5);
      }
      goto LAB_002ac2b6;
    }
  }
  else if ((bVar17 == 0x65) || (uVar4 == 0x45)) {
    local_c8 = result;
    if ((pIVar18 != pIVar5) &&
       (pIVar5 = (IntegerCastData<short> *)((long)&pIVar18->result + 1), pIVar5 < pIVar3)) {
      local_a8._M_dataplus._M_p._0_2_ = 0;
      pdVar14 = (duckdb *)(string_ptr + (long)pIVar18 + uVar10 + 1);
      pcVar11 = (char *)(~uVar10 + (string_size - (long)pIVar18));
      if (*pdVar14 == (duckdb)0x2d) {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar14,pcVar11,(idx_t)&local_a8,pIVar5,SUB41(uVar16,0));
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar14,pcVar11,(idx_t)&local_a8,pIVar5,SUB41(uVar16,0));
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,false>
                          (&local_dc,(int)(short)local_a8._M_dataplus._M_p);
LAB_002ac5a8:
        result = local_c8;
        if (bVar2 != false) goto LAB_002ac2d3;
      }
    }
  }
  else {
    local_c8 = result;
    if (uVar4 == 0x20) goto LAB_002ac46b;
  }
  goto LAB_002abf5e;
LAB_002abf54:
  local_dc._5_3_ = 0;
  local_c8 = result;
  goto LAB_002abf5e;
LAB_002ac1ef:
  do {
    bVar17 = (string_ptr + (long)pIVar18)[uVar10];
    bVar12 = bVar17 - 0x30;
    local_dc.decimal_count = (uint8_t)uVar16;
    local_cc = uVar4;
    local_b0 = pIVar7;
    if (9 < bVar12) {
      local_dc.round_set = local_d0._0_1_;
      local_dc.should_round = (bool)(char)local_c0;
      local_c8 = result;
      if (pIVar7 < pIVar18 || pIVar5 < pIVar6) goto LAB_002ac456;
      goto LAB_002abf5e;
    }
    if ((local_dc.decimal_count == scale) && (local_d0._0_1_ == false)) {
      uVar15 = (undefined7)(uVar13 >> 8);
      local_c0 = (IntegerCastData<short> *)CONCAT44(local_c0._4_4_,(int)CONCAT71(uVar15,4 < bVar12))
      ;
      local_d0 = (undefined4)CONCAT71(uVar15,1);
    }
    bVar2 = uVar16 + uVar4 < 4;
    sVar1 = (ushort)bVar12 + local_dc.result * 10;
    if (!bVar2) {
      sVar1 = local_dc.result;
    }
    local_dc.result = sVar1;
    local_dc.decimal_count = local_dc.decimal_count + bVar2;
    uVar16 = (uint)local_dc.decimal_count;
    uVar13 = ~(ulong)pIVar18 + string_size;
    local_dc.should_round = SUB81(local_c0,0);
    pIVar8 = pIVar3;
    if (uVar13 == uVar10) break;
    if ((string_ptr + (long)pIVar18)[uVar10 + 1] == '_') {
      if ((string_size - (long)pIVar18) - 2 != uVar10) {
        pIVar18 = pIVar18 + 1;
        bVar12 = (string_ptr + (long)pIVar18)[uVar10] - 0x30;
        uVar13 = CONCAT71((int7)((ulong)(string_ptr + (long)pIVar18) >> 8),bVar12);
        if (bVar12 < 10) goto LAB_002ac293;
      }
      local_dc.round_set = SUB41(local_d0,0);
LAB_002ac556:
      local_dc.digit_count = local_dc.digit_count;
      local_dc.decimal_count = local_dc.decimal_count;
      local_dc.round_set = local_dc.round_set;
      local_c8 = result;
      goto LAB_002abf5e;
    }
    pIVar18 = (IntegerCastData<short> *)((long)&pIVar18->result + 1);
LAB_002ac293:
    pIVar8 = pIVar18;
  } while (pIVar18 < pIVar3);
  local_dc.round_set = SUB41(local_d0,0);
LAB_002ac52c:
  if ((pIVar5 < pIVar6) || (local_c8 = result, pIVar7 < pIVar8)) goto LAB_002ac2b6;
LAB_002abf5e:
  local_88 = uVar19;
  if (uVar19 < 0xd) {
    uStack_80._4_4_ = 0;
    uStack_84 = 0;
    uStack_80._0_4_ = 0;
    if (uVar19 == 0) {
LAB_002abf96:
      uStack_80._4_4_ = 0;
      uStack_80._0_4_ = 0;
      uStack_84 = 0;
      string_size = 0;
    }
    else {
      switchD_00b041bd::default(&uStack_84,string_ptr,(ulong)(uVar19 & 0xf));
    }
    string_ptr = (char *)&uStack_84;
    uStack_80 = (char *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
  }
  else {
    uStack_84 = *(undefined4 *)string_ptr;
    uStack_80 = string_ptr;
  }
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,string_ptr,string_ptr + (string_size & 0xffffffff));
  StringUtil::Format<std::__cxx11::string,int,int>
            (&local_a8,(StringUtil *)local_70,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar9,
             params_1,params_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  HandleCastError::AssignError(&local_a8,local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p) !=
      &local_a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p));
  }
  return false;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}